

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O2

bool __thiscall
draco::PlyReader::ParseElementData(PlyReader *this,DecoderBuffer *buffer,int element_index)

{
  long lVar1;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  long lVar2;
  int i;
  long lVar3;
  long lVar4;
  int64_t num_entries;
  pointer local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = (this->elements_).
             super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
             super__Vector_impl_data._M_start + element_index;
  for (local_40 = 0; (int)local_40 < (int)local_48->num_entries_;
      local_40 = (ulong)((int)local_40 + 1)) {
    lVar4 = 0x38;
    lVar3 = 0;
    while( true ) {
      lVar1 = *(long *)&(local_48->properties_).
                        super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                        _M_impl;
      if ((int)(((long)*(pointer *)
                        ((long)&(local_48->properties_).
                                super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                        + 8) - lVar1) / 0x60) <= lVar3) break;
      this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)(lVar4 + lVar1 + -0x18);
      if (*(int *)(lVar4 + lVar1 + 0x20) == 0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
                  (this_00,(const_iterator)*(uchar **)(lVar1 + -0x10 + lVar4),
                   buffer->data_ + buffer->pos_,
                   buffer->data_ + buffer->pos_ + *(int *)(lVar1 + 0x1c + lVar4));
        buffer->pos_ = buffer->pos_ + (long)*(int *)(lVar1 + 0x1c + lVar4);
      }
      else {
        num_entries = 0;
        DecoderBuffer::Decode(buffer,&num_entries,(long)*(int *)(lVar1 + 0x24 + lVar4));
        local_38 = (ulong)(*(long *)(lVar1 + -0x10 + lVar4) - *(long *)(lVar1 + -0x18 + lVar4)) /
                   (ulong)(long)*(int *)(lVar1 + 0x1c + lVar4);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  ((vector<long,_std::allocator<long>_> *)(lVar4 + lVar1),(long *)&local_38);
        std::vector<long,_std::allocator<long>_>::push_back
                  ((vector<long,_std::allocator<long>_> *)(lVar4 + lVar1),&num_entries);
        lVar2 = *(int *)(lVar1 + 0x1c + lVar4) * num_entries;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
                  (this_00,(const_iterator)*(uchar **)(lVar1 + -0x10 + lVar4),
                   buffer->data_ + buffer->pos_,buffer->data_ + buffer->pos_ + lVar2);
        buffer->pos_ = buffer->pos_ + lVar2;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x60;
    }
  }
  return true;
}

Assistant:

bool PlyReader::ParseElementData(DecoderBuffer *buffer, int element_index) {
  PlyElement &element = elements_[element_index];
  for (int entry = 0; entry < element.num_entries(); ++entry) {
    for (int i = 0; i < element.num_properties(); ++i) {
      PlyProperty &prop = element.property(i);
      if (prop.is_list()) {
        // Parse the number of entries for the list element.
        int64_t num_entries = 0;
        buffer->Decode(&num_entries, prop.list_data_type_num_bytes());
        // Store offset to the main data entry.
        prop.list_data_.push_back(prop.data_.size() /
                                  prop.data_type_num_bytes_);
        // Store the number of entries.
        prop.list_data_.push_back(num_entries);
        // Read and store the actual property data
        const int64_t num_bytes_to_read =
            prop.data_type_num_bytes() * num_entries;
        prop.data_.insert(prop.data_.end(), buffer->data_head(),
                          buffer->data_head() + num_bytes_to_read);
        buffer->Advance(num_bytes_to_read);
      } else {
        // Non-list property
        prop.data_.insert(prop.data_.end(), buffer->data_head(),
                          buffer->data_head() + prop.data_type_num_bytes());
        buffer->Advance(prop.data_type_num_bytes());
      }
    }
  }
  return true;
}